

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Glucose::Solver::adaptSolver(Solver *this)

{
  unsigned_long *puVar1;
  uint *puVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  int j;
  int iVar7;
  int i;
  long lVar8;
  
  bVar3 = (float)this->decisions / (float)this->conflicts <= 1.2;
  if (bVar3) {
    this->chanseokStrategy = true;
    this->coLBDBound = 4;
    this->glureduce = true;
    this->firstReduceDB = 2000;
    this->incReduceDB = 0;
    this->nbclausesbeforereduce = 2000;
    this->curRestart = this->conflicts / 2000 + 1;
  }
  puVar1 = (this->stats).data;
  if (puVar1[0x17] < 30000) {
    this->luby_restart = true;
    this->luby_restart_factor = 100;
    this->var_decay = 0.999;
    this->max_var_decay = 0.999;
    bVar4 = true;
  }
  else {
    bVar4 = bVar3;
    if (0xd480 < puVar1[0x17]) {
      bVar4 = true;
      this->chanseokStrategy = true;
      this->glureduce = true;
      this->coLBDBound = 3;
      this->firstReduceDB = 30000;
      this->var_decay = 0.99;
      this->max_var_decay = 0.99;
      this->randomize_on_restarts = true;
    }
  }
  if (puVar1[10] - puVar1[0xb] < 0x4e21) {
    if (!bVar4) goto LAB_001137f5;
  }
  else {
    this->var_decay = 0.91;
    this->max_var_decay = 0.91;
  }
  (this->lbdQueue).queuesize = 0;
  (this->lbdQueue).first = 0;
  (this->lbdQueue).last = 0;
  (this->lbdQueue).sumofqueue = 0;
  this->sumLBD = 0.0;
  this->conflictsRestarts = 0;
  if (this->chanseokStrategy == true) {
    lVar6 = 0;
    iVar7 = 0;
    for (lVar8 = 0; lVar8 < (this->learnts).sz; lVar8 = lVar8 + 1) {
      puVar2 = (this->learnts).data;
      if ((uint)this->coLBDBound <
          ((this->ca).super_RegionAllocator<unsigned_int>.memory[*(uint *)((long)puVar2 + lVar6)] >>
           0xb & 0xfffff)) {
        lVar5 = (long)iVar7;
        iVar7 = iVar7 + 1;
        puVar2[lVar5] = *(uint *)((long)puVar2 + lVar6);
      }
      else {
        vec<unsigned_int>::push(&this->permanentLearnts,(uint *)((long)puVar2 + lVar6));
      }
      lVar6 = lVar6 + 4;
    }
    vec<unsigned_int>::shrink(&this->learnts,(int)lVar8 - iVar7);
  }
LAB_001137f5:
  if (bVar3) {
    for (lVar6 = 0; iVar7 = (this->learnts).sz, lVar6 < iVar7; lVar6 = lVar6 + 1) {
      removeClause(this,(this->learnts).data[lVar6],false);
    }
    vec<unsigned_int>::shrink(&this->learnts,iVar7);
    checkGarbage(this);
    return;
  }
  return;
}

Assistant:

void Solver::adaptSolver() {
    bool adjusted = false;
    bool reinit = false;
    // printf("c\nc Try to adapt solver strategies\nc \n");
    /*  printf("c Adjusting solver for the SAT Race 2015 (alpha feature)\n");
    printf("c key successive Conflicts       : %" PRIu64"\n",stats[noDecisionConflict]);
    printf("c nb unary clauses learnt        : %" PRIu64"\n",stats[nbUn]);
    printf("c key avg dec per conflicts      : %.2f\n", (float)decisions / (float)conflicts);*/
    float decpc = (float) decisions / (float) conflicts;
    if(decpc <= 1.2) {
        chanseokStrategy = true;
        coLBDBound = 4;
        glureduce = true;
        adjusted = true;
        // printf("c Adjusting for low decision levels.\n");
        reinit = true;
        firstReduceDB = 2000;
        nbclausesbeforereduce = firstReduceDB;
        curRestart = (conflicts / nbclausesbeforereduce) + 1;
        incReduceDB = 0;
    }
    if(stats[noDecisionConflict] < 30000) {
        luby_restart = true;
        luby_restart_factor = 100;

        var_decay = 0.999;
        max_var_decay = 0.999;
        adjusted = true;
        // printf("c Adjusting for low successive conflicts.\n");
    }
    if(stats[noDecisionConflict] > 54400) {
        // printf("c Adjusting for high successive conflicts.\n");
        chanseokStrategy = true;
        glureduce = true;
        coLBDBound = 3;
        firstReduceDB = 30000;
        var_decay = 0.99;
        max_var_decay = 0.99;
        randomize_on_restarts = 1;
        adjusted = true;
    }
    if(stats[nbDL2] - stats[nbBin] > 20000) {
        var_decay = 0.91;
        max_var_decay = 0.91;
        adjusted = true;
        // printf("c Adjusting for a very large number of true glue clauses found.\n");
    }
    if(!adjusted) {
        // printf("c Nothing extreme in this problem, continue with glucose default strategies.\n");
    }
    // printf("c\n");
    if(adjusted) { // Let's reinitialize the glucose restart strategy counters
        lbdQueue.fastclear();
        sumLBD = 0;
        conflictsRestarts = 0;
    }

    if(chanseokStrategy && adjusted) {
        int moved = 0;
        int i, j;
        for(i = j = 0; i < learnts.size(); i++) {
            Clause &c = ca[learnts[i]];
            if(c.lbd() <= coLBDBound) {
                permanentLearnts.push(learnts[i]);
                moved++;
            }
            else {
                learnts[j++] = learnts[i];
            }
        }
        learnts.shrink(i - j);
        // printf("c Activating Chanseok Strategy: moved %d clauses to the permanent set.\n", moved);
    }

    if(reinit) {
        assert(decisionLevel() == 0);
        for(int i = 0; i < learnts.size(); i++) {
            removeClause(learnts[i]);
        }
        learnts.shrink(learnts.size());
        checkGarbage();
/*
	order_heap.clear();
	for(int i=0;i<nVars();i++) {
	    polarity[i] = true; 
	    activity[i]=0.0;
	    if (decision[i]) order_heap.insert(i);
	}
	printf("c reinitialization of all variables activity/phase/learnt clauses.\n");
*/
        // printf("c Removing of non permanent clauses.\n");
    }

}